

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void __thiscall
ImGuiMenuColumns::Update(ImGuiMenuColumns *this,float spacing,bool window_reappearing)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,window_reappearing) != 0) {
    this->Widths[0] = 0;
    this->Widths[1] = 0;
    this->Widths[2] = 0;
    this->Widths[3] = 0;
  }
  this->Spacing = (ImU16)(int)spacing;
  CalcNextTotalWidth(this,true);
  this->Widths[0] = 0;
  this->Widths[1] = 0;
  this->Widths[2] = 0;
  this->Widths[3] = 0;
  this->TotalWidth = this->NextTotalWidth;
  this->NextTotalWidth = 0;
  return;
}

Assistant:

void ImGuiMenuColumns::Update(float spacing, bool window_reappearing)
{
    if (window_reappearing)
        memset(Widths, 0, sizeof(Widths));
    Spacing = (ImU16)spacing;
    CalcNextTotalWidth(true);
    memset(Widths, 0, sizeof(Widths));
    TotalWidth = NextTotalWidth;
    NextTotalWidth = 0;
}